

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall booster::locale::generator::data::data(data *this,localization_backend_manager *mgr)

{
  localization_backend_manager *in_RDI;
  localization_backend_manager *in_stack_ffffffffffffffe0;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::locale,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::locale>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::locale,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::locale>_>_>
         *)0x2353fd);
  std::mutex::mutex((mutex *)0x23540b);
  *(undefined4 *)
   &in_RDI[0xb].pimpl_._M_t.
    super___uniq_ptr_impl<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_booster::locale::localization_backend_manager::impl_*,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
    .super__Head_base<0UL,_booster::locale::localization_backend_manager::impl_*,_false>.
    _M_head_impl = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[0xb].pimpl_._M_t.
           super___uniq_ptr_impl<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_booster::locale::localization_backend_manager::impl_*,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
           .super__Head_base<0UL,_booster::locale::localization_backend_manager::impl_*,_false>.
           _M_head_impl + 4) = 0xffff;
  *(undefined1 *)
   &in_RDI[0xc].pimpl_._M_t.
    super___uniq_ptr_impl<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_booster::locale::localization_backend_manager::impl_*,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
    .super__Head_base<0UL,_booster::locale::localization_backend_manager::impl_*,_false>.
    _M_head_impl = 0;
  *(undefined1 *)
   ((long)&in_RDI[0xc].pimpl_._M_t.
           super___uniq_ptr_impl<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_booster::locale::localization_backend_manager::impl_*,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
           .super__Head_base<0UL,_booster::locale::localization_backend_manager::impl_*,_false>.
           _M_head_impl + 1) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x235434);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x235447);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x23545d);
  localization_backend_manager::localization_backend_manager(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

data(localization_backend_manager const &mgr)  :
                cats(all_categories),
                chars(all_characters),
                caching_enabled(false),
                use_ansi_encoding(false),
                backend_manager(mgr)
            {
            }